

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O2

void gimage::gauss<float>(Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long k;
  long lVar6;
  long i_00;
  long i;
  long lVar7;
  int d;
  long lVar8;
  float fVar9;
  GaussKernel kernel;
  ImageFloat tmp;
  
  GaussKernel::GaussKernel(&kernel,s);
  lVar8 = image->height;
  if (image->height < image->width) {
    lVar8 = image->width;
  }
  Image<float,_gimage::PixelTraits<float>_>::Image(&tmp,lVar8,1,1);
  pfVar1 = **tmp.img;
  for (lVar8 = 0; lVar8 < image->depth; lVar8 = lVar8 + 1) {
    lVar6 = 0;
    while( true ) {
      lVar7 = image->height;
      if (lVar7 <= lVar6) break;
      for (lVar7 = 0; lVar2 = image->width, lVar7 < lVar2; lVar7 = lVar7 + 1) {
        fVar9 = GaussKernel::convolveHorizontal<float>(&kernel,image,lVar7,lVar6,(int)lVar8);
        pfVar1[lVar7] = fVar9;
      }
      pfVar4 = image->img[lVar8][lVar6];
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      for (lVar7 = 0; lVar2 != lVar7; lVar7 = lVar7 + 1) {
        pfVar4[lVar7] = pfVar1[lVar7];
      }
      lVar6 = lVar6 + 1;
    }
    lVar6 = image->width;
    lVar2 = 0;
    for (i_00 = 0; i_00 < lVar6; i_00 = i_00 + 1) {
      for (lVar6 = 0; lVar6 < lVar7; lVar6 = lVar6 + 1) {
        fVar9 = GaussKernel::convolveVertical<float>(&kernel,image,i_00,lVar6,(int)lVar8);
        pfVar1[lVar6] = fVar9;
        lVar7 = image->height;
      }
      lVar6 = image->width;
      lVar3 = 0;
      if (0 < lVar7) {
        lVar3 = lVar7;
      }
      pfVar4 = (float *)((long)*image->img[lVar8] + lVar2);
      for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
        *pfVar4 = pfVar1[lVar5];
        pfVar4 = pfVar4 + lVar6;
      }
      lVar2 = lVar2 + 4;
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&tmp);
  GaussKernel::~GaussKernel(&kernel);
  return;
}

Assistant:

void gauss(Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(std::max(image.getWidth(), image.getHeight()), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal in place

    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        p[i]=kernel.convolveHorizontal(image, i, k, d);
      }

      T *tp=image.getPtr(0, k, d);
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(p[i]);
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(image, i, k, d);
      }

      T *tp=image.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=image.getWidth();
      }
    }
  }
}